

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine_unix.cpp
# Opt level: O0

bool __thiscall QFSFileEngine::setPermissions(QFSFileEngine *this,uint perms)

{
  QFSFileEnginePrivate *pQVar1;
  uint in_ESI;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  bool ok;
  QFSFileEnginePrivate *d;
  QSystemError error;
  undefined4 in_stack_ffffffffffffff68;
  MetaDataFlag in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  QFlag in_stack_ffffffffffffff74;
  undefined8 in_stack_ffffffffffffff78;
  QFlagsStorage<QFileSystemMetaData::MetaDataFlag> flags;
  undefined4 in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  QFlagsStorage<QFileDevice::Permission> permissions;
  bool local_61;
  QFlag local_24 [2];
  QFlag local_1c [2];
  QFlagsStorage<QFileDevice::Permission> in_stack_ffffffffffffffec;
  QSystemError local_10;
  long local_8;
  
  flags.i = (Int)((ulong)in_stack_ffffffffffffff78 >> 0x20);
  permissions.i = (Int)((ulong)in_RDI >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = d_func((QFSFileEngine *)0x216594);
  local_10 = (QSystemError)&DAT_aaaaaaaaaaaaaaaa;
  QSystemError::QSystemError(&local_10);
  QFlags<QFileSystemMetaData::MetaDataFlag>::QFlags
            ((QFlags<QFileSystemMetaData::MetaDataFlag> *)
             CONCAT44(in_stack_ffffffffffffff74.i,in_stack_ffffffffffffff70),
             in_stack_ffffffffffffff6c);
  QFileSystemMetaData::clearFlags
            ((QFileSystemMetaData *)CONCAT44(in_stack_ffffffffffffff74.i,in_stack_ffffffffffffff70),
             (MetaDataFlags)flags.i);
  if (pQVar1->fd == -1) {
    flags.i = (Int)((ulong)&pQVar1->fileEntry >> 0x20);
    QFlag::QFlag(local_24,in_ESI);
    QFlags<QFileDevice::Permission>::QFlagsStorageHelper
              ((QFlags<QFileDevice::Permission> *)
               CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
               in_stack_ffffffffffffff74);
    local_61 = QFileSystemEngine::setPermissions
                         ((QFileSystemEntry *)
                          CONCAT44(in_stack_ffffffffffffff74.i,in_stack_ffffffffffffff70),
                          (Permissions)in_stack_ffffffffffffffec.i,
                          (QSystemError *)
                          CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  }
  else {
    in_stack_ffffffffffffff84 = pQVar1->fd;
    QFlag::QFlag(local_1c,in_ESI);
    QFlags<QFileDevice::Permission>::QFlagsStorageHelper
              ((QFlags<QFileDevice::Permission> *)
               CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
               in_stack_ffffffffffffff74);
    local_61 = QFileSystemEngine::setPermissions
                         (flags.i,(Permissions)permissions.i,
                          (QSystemError *)
                          CONCAT44(in_stack_ffffffffffffff74.i,in_stack_ffffffffffffff70));
  }
  if (local_61 == false) {
    QSystemError::toString
              ((QSystemError *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    QAbstractFileEngine::setError
              ((QAbstractFileEngine *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               flags.i,(QString *)CONCAT44(in_stack_ffffffffffffff74.i,in_stack_ffffffffffffff70));
    QString::~QString((QString *)0x2166c4);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_61 != false;
}

Assistant:

bool QFSFileEngine::setPermissions(uint perms)
{
    Q_D(QFSFileEngine);
    QSystemError error;
    bool ok;

    // clear cached state (if any)
    d->metaData.clearFlags(QFileSystemMetaData::Permissions);

    if (d->fd != -1)
        ok = QFileSystemEngine::setPermissions(d->fd, QFile::Permissions(perms), error);
    else
        ok = QFileSystemEngine::setPermissions(d->fileEntry, QFile::Permissions(perms), error);
    if (!ok) {
        setError(QFile::PermissionsError, error.toString());
        return false;
    }
    return true;
}